

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>::operator=
          (CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *this,
          CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *other)

{
  GetAsyncCommandResponse_SetupTracing *this_00;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *other_local;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (GetAsyncCommandResponse_SetupTracing *)operator_new(0x58);
  perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing::GetAsyncCommandResponse_SetupTracing
            (this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }